

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O1

void pd_tilde_pdtilde(t_pd_tilde *x,t_symbol *s,int argc,t_atom *argv)

{
  uint uVar1;
  uint uVar2;
  t_atom *ptVar3;
  int iVar4;
  __pid_t _Var5;
  t_symbol *ptVar6;
  t_symbol *ptVar7;
  t_symbol *ptVar8;
  size_t sVar9;
  FILE *__stream;
  FILE *infd;
  char *pcVar10;
  long *plVar11;
  t_pd_tilde *ptVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  char **ppcVar16;
  int pipe2 [2];
  int pipe1 [2];
  char noutsigstr [20];
  char ninsigstr [20];
  char sampleratestr [40];
  char *execargv [114];
  char tmpbuf [1000];
  char pdexecbuf [1000];
  char scheddirstring [1000];
  char schedbuf [1000];
  char patchdir [1000];
  uint local_189c;
  int local_1898;
  int local_1894;
  int local_1890;
  int local_188c;
  t_pd_tilde *local_1888;
  t_atom *local_1880;
  int local_1878;
  undefined4 local_1874;
  char *local_1870;
  char local_1868 [32];
  char local_1848 [32];
  char local_1828 [48];
  stat local_17f8;
  char *local_1768;
  char *local_1760;
  char *local_1758;
  char *local_1750;
  char *local_1748;
  char *local_1740;
  char *local_1738;
  char *local_1730;
  char *local_1728;
  char *local_1720;
  char *local_1718;
  char *local_1710;
  char *local_1708;
  void *local_1700;
  long local_16f8 [100];
  char local_13d8 [1008];
  char local_fe8 [1008];
  char local_bf8 [1008];
  char local_808 [1008];
  char local_418 [1000];
  
  if ((argc < 1) || (argv->a_type != A_SYMBOL)) {
    ptVar7 = gensym("?");
  }
  else {
    ptVar7 = (argv->a_w).w_symbol;
  }
  ptVar6 = gensym("start");
  if (ptVar7 != ptVar6) {
    ptVar6 = gensym("stop");
    if (ptVar7 == ptVar6) {
      if (x->x_infd == (FILE *)0x0) {
        return;
      }
      pd_tilde_close(x);
      return;
    }
    ptVar6 = gensym("pddir");
    if (ptVar7 == ptVar6) {
      if ((1 < argc) && (argv[1].a_type == A_SYMBOL)) {
        x->x_pddir = (t_symbol *)argv[1].a_w;
        return;
      }
      pd_error(x,"pd~ pddir: needs symbol argument");
      return;
    }
    pd_error(x,"pd~: unknown control message: %s",ptVar7->s_name);
    return;
  }
  if (x->x_infd != (FILE *)0x0) {
    pd_tilde_close(x);
  }
  ptVar7 = canvas_getdir(x->x_canvas);
  local_1870 = ptVar7->s_name;
  ptVar7 = x->x_schedlibdir;
  ptVar6 = gensym(".");
  if ((ptVar7 == ptVar6) && (ptVar6 = x->x_pddir, ptVar8 = gensym("."), ptVar6 != ptVar8)) {
    pcVar14 = x->x_pddir->s_name;
    sVar9 = strlen(pcVar14);
    if ((int)(uint)sVar9 < 4) {
LAB_001a94e3:
      pcVar10 = "%s/extra/pd~";
    }
    else {
      uVar15 = (ulong)((uint)sVar9 & 0x7fffffff);
      iVar4 = strcmp(pcVar14 + (uVar15 - 3),"bin");
      pcVar10 = "%s/../extra/pd~";
      if ((iVar4 != 0) && (iVar4 = strcmp(pcVar14 + (uVar15 - 4),"bin/"), iVar4 != 0))
      goto LAB_001a94e3;
    }
    snprintf(local_bf8,1000,pcVar10,pcVar14);
    ptVar7 = gensym(local_bf8);
  }
  pcVar14 = x->x_pddir->s_name;
  pcVar10 = ptVar7->s_name;
  uVar1 = x->x_ninsig;
  uVar2 = x->x_noutsig;
  local_1878 = x->x_fifo;
  local_1880 = (t_atom *)CONCAT44(local_1880._4_4_,x->x_sr);
  x->x_childpid = -1;
  local_1888 = x;
  if (argc < 0x66) {
    local_189c = argc - 1;
  }
  else {
    local_189c = 100;
    post("pd~: args truncated to %d items",100);
  }
  sprintf(local_1848,"%d",(ulong)uVar1);
  sprintf(local_1868,"%d",(ulong)uVar2);
  sprintf(local_1828,"%f",SUB84((double)local_1880._0_4_,0));
  snprintf(local_13d8,1000,"%s/bin/pd",pcVar14);
  sys_bashfilename(local_13d8,local_fe8);
  iVar4 = stat(local_fe8,&local_17f8);
  if (iVar4 < 0) {
    snprintf(local_13d8,1000,"%s/../../../bin/pd",pcVar14);
    sys_bashfilename(local_13d8,local_fe8);
    iVar4 = stat(local_fe8,&local_17f8);
    if (iVar4 < 0) {
      snprintf(local_13d8,1000,"%s/pd",pcVar14);
      sys_bashfilename(local_13d8,local_fe8);
      iVar4 = stat(local_fe8,&local_17f8);
      if (iVar4 < 0) {
        pcVar14 = local_fe8;
        goto LAB_001a9739;
      }
    }
  }
  pcVar14 = ".l_amd64";
  ppcVar16 = pd_tilde_dllextent;
  local_1880 = argv;
  do {
    ppcVar16 = ppcVar16 + 1;
    snprintf(local_13d8,1000,"%s/pdsched%s",pcVar10,pcVar14);
    sys_bashfilename(local_13d8,local_808);
    iVar4 = stat(local_808,&local_17f8);
    if (-1 < iVar4) {
      snprintf(local_13d8,1000,"%s/pdsched",pcVar10);
      sys_bashfilename(local_13d8,local_808);
      snprintf(local_bf8,1000,"%s",local_fe8);
      snprintf(local_418,1000,"%s",local_1870);
      ptVar3 = local_1880;
      local_1760 = "-schedlib";
      local_1750 = "-extraflags";
      local_1748 = "b";
      if (local_1888->x_binary == 0) {
        local_1748 = "a";
      }
      local_1740 = "-path";
      local_1730 = "-inchannels";
      local_1728 = local_1848;
      local_1720 = "-outchannels";
      local_1718 = local_1868;
      local_1710 = "-r";
      local_1708 = local_1828;
      local_1768 = local_fe8;
      local_1758 = local_808;
      local_1738 = local_418;
      if (0 < (int)local_189c) {
        lVar13 = 0;
        do {
          iVar4 = *(int *)((long)&ptVar3[1].a_type + lVar13 * 2);
          if (iVar4 == 1) {
            sprintf(local_13d8,"%f",SUB84((double)*(float *)((long)&ptVar3[1].a_w + lVar13 * 2),0));
          }
          else if (iVar4 == 2) {
            snprintf(local_13d8,1000,"%s",**(undefined8 **)((long)&ptVar3[1].a_w + lVar13 * 2));
          }
          sVar9 = strlen(local_13d8);
          pcVar14 = (char *)malloc(sVar9 + 1);
          *(char **)((long)local_16f8 + lVar13 + -8) = pcVar14;
          strcpy(pcVar14,local_13d8);
          lVar13 = lVar13 + 8;
        } while ((ulong)local_189c << 3 != lVar13);
      }
      local_16f8[(long)(int)local_189c + -1] = 0;
      iVar4 = pipe(&local_1890);
      ptVar12 = local_1888;
      if (iVar4 < 0) {
        pd_error(local_1888,"pd~: can\'t create pipe");
      }
      else {
        iVar4 = pipe(&local_1898);
        ptVar12 = local_1888;
        if (iVar4 < 0) {
          pd_error(local_1888,"pd~: can\'t create pipe");
        }
        else {
          _Var5 = fork();
          ptVar12 = local_1888;
          if (-1 < _Var5) {
            if (_Var5 != 0) {
              if (local_1700 != (void *)0x0) {
                plVar11 = local_16f8;
                do {
                  free(local_1700);
                  local_1700 = (void *)*plVar11;
                  plVar11 = plVar11 + 1;
                } while (local_1700 != (void *)0x0);
              }
              close(local_1890);
              close(local_1894);
              fcntl(local_188c,2,1);
              fcntl(local_1898,2,1);
              __stream = fdopen(local_188c,"w");
              infd = fdopen(local_1898,"r");
              ptVar12 = local_1888;
              local_1888->x_childpid = _Var5;
              if (0 < local_1878) {
                iVar4 = local_1878;
                do {
                  if (ptVar12->x_binary == 0) {
                    fputs(";\n0;\n",__stream);
                  }
                  else {
                    putc(4,__stream);
                    local_1874 = 0;
                    putc(1,__stream);
                    fwrite(&local_1874,4,1,__stream);
                    putc(4,__stream);
                  }
                  iVar4 = iVar4 + -1;
                } while (iVar4 != 0);
              }
              fflush(__stream);
              binbuf_clear(ptVar12->x_binbuf);
              pd_tilde_readmessages(ptVar12,(FILE *)infd);
              ptVar12->x_outfd = (FILE *)__stream;
              ptVar12->x_infd = (FILE *)infd;
              return;
            }
            if (local_1894 == 0) {
              local_1894 = dup(0);
            }
            if (local_1890 != 0) {
              dup2(local_1890,0);
              close(local_1890);
            }
            if (local_1894 != 1) {
              dup2(local_1894,1);
              close(local_1894);
            }
            if (1 < local_188c) {
              close(local_188c);
            }
            if (1 < local_1898) {
              close(local_1898);
            }
            execv(local_bf8,&local_1768);
            _exit(1);
          }
          pd_error(local_1888,"pd~: can\'t fork");
          close(local_1898);
          close(local_1894);
          if (0 < ptVar12->x_childpid) {
            waitpid(ptVar12->x_childpid,(int *)0x0,0);
          }
        }
        close(local_1890);
        close(local_188c);
      }
      goto LAB_001a9b46;
    }
    pcVar14 = *ppcVar16;
  } while (pcVar14 != (char *)0x0);
  pcVar14 = local_808;
LAB_001a9739:
  ptVar12 = local_1888;
  pd_error(local_1888,"pd~: can\'t stat %s",pcVar14);
LAB_001a9b46:
  ptVar12->x_infd = (FILE *)0x0;
  ptVar12->x_outfd = (FILE *)0x0;
  ptVar12->x_childpid = -1;
  post("pd~ startup failed");
  return;
}

Assistant:

static void pd_tilde_pdtilde(t_pd_tilde *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_symbol *sel = ((argc > 0 && argv->a_type == A_SYMBOL) ?
        argv->a_w.w_symbol : gensym("?")), *schedlibdir;
    const char *patchdir;

    if (sel == gensym("start"))
    {
        char pdargstring[MAXPDSTRING];
#ifdef MAX
    critical_enter(0);
#endif
        if (x->x_infd)
            pd_tilde_close(x);
#ifdef MAX
    critical_exit(0);
#endif
        pdargstring[0] = 0;
        argc--; argv++;
#ifdef PD
        patchdir = canvas_getdir(x->x_canvas)->s_name;
#endif
#ifdef MSP
        patchdir = ".";
#endif
        schedlibdir = x->x_schedlibdir;
        if (schedlibdir == gensym(".") && x->x_pddir != gensym("."))
        {
            const char *pds = x->x_pddir->s_name;
            char scheddirstring[MAXPDSTRING];
            int l = strlen(pds);
            if (l >= 4 && (!strcmp(pds+l-3, "bin") || !strcmp(pds+l-4, "bin/")))
                snprintf(scheddirstring, MAXPDSTRING, "%s/../extra/pd~", pds);
            else snprintf(scheddirstring, MAXPDSTRING, "%s/extra/pd~", pds);
            schedlibdir = gensym(scheddirstring);
        }
        pd_tilde_dostart(x, x->x_pddir->s_name, schedlibdir->s_name,
            patchdir, argc, argv, x->x_ninsig, x->x_noutsig, x->x_fifo,
                x->x_sr);
    }
    else if (sel == gensym("stop"))
    {
#ifdef MAX
    critical_enter(0);
#endif
        if (x->x_infd)
            pd_tilde_close(x);
#ifdef MAX
    critical_exit(0);
#endif
    }
    else if (sel == gensym("pddir"))
    {
        if ((argc > 1) && argv[1].a_type == A_SYMBOL)
        {
            t_symbol *sym = argv[1].a_w.w_symbol;
#ifdef MSP
            if (sym->s_name[0] == ':')
                sym = gensym(s->s_name+1);
#endif
            x->x_pddir = sym;
        }
        else PDERROR "pd~ pddir: needs symbol argument");
    }
    else PDERROR "pd~: unknown control message: %s", sel->s_name);
}